

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

string * __thiscall
pbrt::BilinearIntersection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BilinearIntersection *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Point2<float>const&,float_const&>
            (__return_storage_ptr__,"[ BilinearIntersection uv: %s t: %f",&this->uv,&this->t);
  return __return_storage_ptr__;
}

Assistant:

std::string BilinearIntersection::ToString() const {
    return StringPrintf("[ BilinearIntersection uv: %s t: %f", uv, t);
}